

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
dynamic_xpression<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::peek(dynamic_xpression<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,xpression_peeker<char> *peeker)

{
  char *pcVar1;
  
  hash_peek_bitset<char>::
  set_char<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            (peeker->bset_,
             *(this->
              super_string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>
              ).str_._M_dataplus._M_p,true,
             (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)peeker->traits_);
  pcVar1 = (this->
           super_string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>
           ).str_._M_dataplus._M_p;
  (peeker->str_).begin_ = pcVar1;
  (peeker->str_).end_ =
       pcVar1 + (this->
                super_string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>
                ).str_._M_string_length;
  (peeker->str_).icase_ = true;
  return;
}

Assistant:

virtual void peek(xpression_peeker<char_type> &peeker) const
    {
        this->peek_next_(peeker.accept(*static_cast<Matcher const *>(this)), peeker);
    }